

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O3

void __thiscall xercesc_4_0::WFElemStack::~WFElemStack(WFElemStack *this)

{
  XMLCh *p;
  ulong uVar1;
  
  if (this->fStackCapacity != 0) {
    uVar1 = 0;
    do {
      if (this->fStack[uVar1] == (StackElem *)0x0) break;
      p = this->fStack[uVar1]->fThisElement;
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
      XMemory::operator_delete((XMemory *)this->fStack[uVar1],p);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->fStackCapacity);
  }
  if (this->fMap != (PrefMapElem *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fStack);
  XMLStringPool::~XMLStringPool(&this->fPrefixPool);
  return;
}

Assistant:

WFElemStack::~WFElemStack()
{
    //
    //  Start working from the bottom of the stack and clear it out as we
    //  go up. Once we hit an uninitialized one, we can break out.
    //
    for (XMLSize_t stackInd = 0; stackInd < fStackCapacity; stackInd++)
    {
        // If this entry has been set, then lets clean it up
        if (!fStack[stackInd])
            break;

        fMemoryManager->deallocate(fStack[stackInd]->fThisElement);//delete [] fStack[stackInd]->fThisElement;
        delete fStack[stackInd];
    }

    if (fMap)
        fMemoryManager->deallocate(fMap);//delete [] fMap;

    // Delete the stack array itself now
    fMemoryManager->deallocate(fStack);//delete [] fStack;
}